

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O3

void __thiscall VcprojGenerator::initCompilerTool(VcprojGenerator *this)

{
  VCCLCompilerTool *this_00;
  QStringList *pQVar1;
  QMakeProject *pQVar2;
  QArrayData *pQVar3;
  QString *pQVar4;
  qsizetype qVar5;
  Data *pDVar6;
  Data *pDVar7;
  char cVar8;
  bool bVar9;
  ProStringList *pPVar10;
  long lVar11;
  ProString *flag;
  ProString *pPVar12;
  long in_FS_OFFSET;
  QAnyStringView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QStringView config;
  QStringView config_00;
  QArrayDataPointer<ProString> local_d8;
  ProKey local_b8;
  ProString local_88;
  QString local_58;
  QRegularExpressionMatch local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey(&local_b8,"OBJECTS_DIR");
  QMakeEvaluator::first(&local_88,&pQVar2->super_QMakeEvaluator,&local_b8);
  ProString::toQString(&local_58,&local_88);
  if (&(local_88.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) {
    QVar13.m_size = (size_t)".\\";
    QVar13.field_0.m_data = &local_58;
    QString::assign(QVar13);
  }
  if (0x9f < (int)(this->vcProject).Configuration.CompilerVersion) {
    (this->vcProject).Configuration.compiler.Optimization = optimizeDisabled;
  }
  QString::operator=(&(this->vcProject).Configuration.compiler.AssemblerListingLocation,
                     (QString *)&local_58);
  QString::operator=(&(this->vcProject).Configuration.compiler.ObjectFile,(QString *)&local_58);
  (this->vcProject).Configuration.compiler.ExceptionHandling = ehNone;
  if (this->usePCH == true) {
    (this->vcProject).Configuration.compiler.UsePrecompiledHeader = pchUseUsingSpecific;
    local_b8.super_ProString.m_string.d.ptr = (char16_t *)&this->precompPch;
    local_b8.super_ProString.m_string.d.d = (Data *)anon_var_dwarf_5fc1b7;
    QStringBuilder<const_char_(&)[11],_QString_&>::convertTo<QString>
              (&local_88.m_string,(QStringBuilder<const_char_(&)[11],_QString_&> *)&local_b8);
    pQVar3 = &((this->vcProject).Configuration.compiler.PrecompiledHeaderFile.d.d)->super_QArrayData
    ;
    pQVar4 = (QString *)(this->vcProject).Configuration.compiler.PrecompiledHeaderFile.d.ptr;
    (this->vcProject).Configuration.compiler.PrecompiledHeaderFile.d.d = local_88.m_string.d.d;
    (this->vcProject).Configuration.compiler.PrecompiledHeaderFile.d.ptr = local_88.m_string.d.ptr;
    qVar5 = (this->vcProject).Configuration.compiler.PrecompiledHeaderFile.d.size;
    (this->vcProject).Configuration.compiler.PrecompiledHeaderFile.d.size = local_88.m_string.d.size
    ;
    local_88.m_string.d.d = (Data *)pQVar3;
    local_88.m_string.d.ptr = (char16_t *)pQVar4;
    local_88.m_string.d.size = qVar5;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
    pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey(&local_b8,"PRECOMPILED_HEADER");
    QMakeEvaluator::first(&local_88,&pQVar2->super_QMakeEvaluator,&local_b8);
    ProString::toQString((QString *)&local_d8,&local_88);
    pQVar3 = &((this->vcProject).Configuration.compiler.PrecompiledHeaderThrough.d.d)->
              super_QArrayData;
    pPVar12 = (ProString *)(this->vcProject).Configuration.compiler.PrecompiledHeaderThrough.d.ptr;
    (this->vcProject).Configuration.compiler.PrecompiledHeaderThrough.d.d = (Data *)local_d8.d;
    (this->vcProject).Configuration.compiler.PrecompiledHeaderThrough.d.ptr =
         (char16_t *)local_d8.ptr;
    qVar5 = (this->vcProject).Configuration.compiler.PrecompiledHeaderThrough.d.size;
    (this->vcProject).Configuration.compiler.PrecompiledHeaderThrough.d.size = local_d8.size;
    local_d8.d = (Data *)pQVar3;
    local_d8.ptr = pPVar12;
    local_d8.size = qVar5;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
    if (&(local_88.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)&local_88,"PRECOMPILED_HEADER");
    pPVar10 = QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&local_88);
    ProStringList::toQStringList((QStringList *)&local_d8,pPVar10);
    qVar5 = local_d8.size;
    pPVar12 = local_d8.ptr;
    pDVar6 = local_d8.d;
    local_d8.size = 0;
    local_d8.d = (Data *)0x0;
    local_d8.ptr = (ProString *)0x0;
    local_b8.super_ProString.m_string.d.d =
         (Data *)(this->vcProject).Configuration.compiler.ForcedIncludeFiles.d.d;
    local_b8.super_ProString.m_string.d.ptr =
         (char16_t *)(this->vcProject).Configuration.compiler.ForcedIncludeFiles.d.ptr;
    (this->vcProject).Configuration.compiler.ForcedIncludeFiles.d.d = (Data *)pDVar6;
    (this->vcProject).Configuration.compiler.ForcedIncludeFiles.d.ptr = &pPVar12->m_string;
    local_b8.super_ProString.m_string.d.size =
         (this->vcProject).Configuration.compiler.ForcedIncludeFiles.d.size;
    (this->vcProject).Configuration.compiler.ForcedIncludeFiles.d.size = qVar5;
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_b8);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_d8);
    if (&(local_88.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_88,"QMAKE_CFLAGS");
  pPVar10 = QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&local_88);
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (ProString *)0x0;
  local_d8.size = 0;
  if (relevantCFlags(ProStringList_const&)::rex == '\0') {
    initCompilerTool();
  }
  this_00 = &(this->vcProject).Configuration.compiler;
  lVar11 = (pPVar10->super_QList<ProString>).d.size;
  if (lVar11 != 0) {
    pPVar12 = (pPVar10->super_QList<ProString>).d.ptr;
    lVar11 = lVar11 * 0x30;
    do {
      ProString::toQString((QString *)&local_b8,pPVar12);
      QRegularExpression::match(local_40,&relevantCFlags(ProStringList_const&)::rex,&local_b8,0,0,0)
      ;
      cVar8 = QRegularExpressionMatch::hasMatch();
      QRegularExpressionMatch::~QRegularExpressionMatch(local_40);
      if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (cVar8 != '\0') {
        QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                  ((QMovableArrayOps<ProString> *)&local_d8,local_d8.size,pPVar12);
        QList<ProString>::end((QList<ProString> *)&local_d8);
      }
      pPVar12 = pPVar12 + 1;
      lVar11 = lVar11 + -0x30;
    } while (lVar11 != 0);
  }
  VCToolBase::parseOptions(&this_00->super_VCToolBase,(ProStringList *)&local_d8);
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_d8);
  if (&(local_88.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_88,"QMAKE_CXXFLAGS");
  pPVar10 = QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&local_88);
  VCToolBase::parseOptions(&this_00->super_VCToolBase,pPVar10);
  if (&(local_88.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  QVar14.m_data = (storage_type *)0x7;
  QVar14.m_size = (qsizetype)&local_88;
  QString::fromUtf8(QVar14);
  pDVar7 = local_88.m_string.d.d;
  config.m_data = local_88.m_string.d.ptr;
  config.m_size = local_88.m_string.d.size;
  bVar9 = QMakeEvaluator::isActiveConfig(&pQVar2->super_QMakeEvaluator,config,false);
  if (&pDVar7->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar7->super_QArrayData,2,0x10);
    }
  }
  if (!bVar9) {
    pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    QVar15.m_data = (storage_type *)0x7;
    QVar15.m_size = (qsizetype)&local_88;
    QString::fromUtf8(QVar15);
    pDVar7 = local_88.m_string.d.d;
    config_00.m_data = local_88.m_string.d.ptr;
    config_00.m_size = local_88.m_string.d.size;
    bVar9 = QMakeEvaluator::isActiveConfig(&pQVar2->super_QMakeEvaluator,config_00,false);
    if (&pDVar7->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar7->super_QArrayData,2,0x10);
      }
    }
    if (!bVar9) goto LAB_002480c7;
  }
  QVar16.m_data = &DAT_00000008;
  QVar16.m_size = (qsizetype)&local_88;
  QString::fromUtf8(QVar16);
  local_b8.super_ProString.m_string.d.d = local_88.m_string.d.d;
  local_b8.super_ProString.m_string.d.ptr = local_88.m_string.d.ptr;
  local_b8.super_ProString.m_string.d.size = local_88.m_string.d.size;
  pQVar1 = &(this->vcProject).Configuration.compiler.PreprocessorDefinitions;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)pQVar1,
             (this->vcProject).Configuration.compiler.PreprocessorDefinitions.d.size,
             (QString *)&local_b8);
  QList<QString>::end(pQVar1);
  if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_002480c7:
  pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_88,"DEFINES");
  pPVar10 = QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&local_88);
  ProStringList::toQStringList((QStringList *)&local_b8,pPVar10);
  pQVar1 = &(this->vcProject).Configuration.compiler.PreprocessorDefinitions;
  QList<QString>::operator+=(pQVar1,(QList<QString> *)&local_b8);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_b8);
  if (&(local_88.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_88,"PRL_EXPORT_DEFINES");
  pPVar10 = QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&local_88);
  ProStringList::toQStringList((QStringList *)&local_b8,pPVar10);
  QList<QString>::operator+=(pQVar1,(QList<QString> *)&local_b8);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_b8);
  if (&(local_88.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_88,"MSVCPROJ_INCPATH");
  pPVar10 = QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&local_88);
  VCToolBase::parseOptions(&this_00->super_VCToolBase,pPVar10);
  if (&(local_88.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void VcprojGenerator::initCompilerTool()
{
    QString placement = project->first("OBJECTS_DIR").toQString();
    if(placement.isEmpty())
        placement = ".\\";

    VCConfiguration &conf = vcProject.Configuration;
    if (conf.CompilerVersion >= NET2010) {
        // adjust compiler tool defaults for VS 2010 and above
        conf.compiler.Optimization = optimizeDisabled;
    }
    conf.compiler.AssemblerListingLocation = placement ;
    conf.compiler.ObjectFile = placement ;
    conf.compiler.ExceptionHandling = ehNone;
    // PCH
    if (usePCH) {
        conf.compiler.UsePrecompiledHeader     = pchUseUsingSpecific;
        conf.compiler.PrecompiledHeaderFile    = "$(IntDir)\\" + precompPch;
        conf.compiler.PrecompiledHeaderThrough = project->first("PRECOMPILED_HEADER").toQString();
        conf.compiler.ForcedIncludeFiles       = project->values("PRECOMPILED_HEADER").toQStringList();
    }

    conf.compiler.parseOptions(relevantCFlags(project->values("QMAKE_CFLAGS")));
    conf.compiler.parseOptions(project->values("QMAKE_CXXFLAGS"));

    if (project->isActiveConfig("windows"))
        conf.compiler.PreprocessorDefinitions += "_WINDOWS";
    else if (project->isActiveConfig("console"))
        conf.compiler.PreprocessorDefinitions += "_CONSOLE";

    conf.compiler.PreprocessorDefinitions += project->values("DEFINES").toQStringList();
    conf.compiler.PreprocessorDefinitions += project->values("PRL_EXPORT_DEFINES").toQStringList();
    conf.compiler.parseOptions(project->values("MSVCPROJ_INCPATH"));
}